

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  TransformerLogLin *this_00;
  ImVec2 IVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImPlotPoint IVar10;
  ImRect local_48;
  ImVec2 local_38;
  
  this_00 = this->Transformer;
  IVar10 = GetterXsYs<short>::operator()(this->Getter,prim + 1);
  local_48.Max = (ImVec2)IVar10.y;
  local_48.Min = (ImVec2)IVar10.x;
  IVar2 = TransformerLogLin::operator()(this_00,(ImPlotPoint *)&local_48);
  fVar6 = IVar2.x;
  fVar7 = IVar2.y;
  IVar1 = this->P1;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = IVar1.x;
  auVar8._4_4_ = IVar1.y;
  auVar9._8_4_ = extraout_XMM0_Dc;
  auVar9._0_4_ = IVar2.x;
  auVar9._4_4_ = IVar2.y;
  auVar9._12_4_ = extraout_XMM0_Dd;
  auVar9 = minps(auVar8,auVar9);
  uVar4 = -(uint)(fVar6 <= IVar1.x);
  uVar5 = -(uint)(fVar7 <= IVar1.y);
  local_48.Max = (ImVec2)(CONCAT44(~uVar5 & (uint)fVar7,~uVar4 & (uint)fVar6) |
                         CONCAT44((uint)IVar1.y & uVar5,(uint)IVar1.x & uVar4));
  local_48.Min = auVar9._0_8_;
  bVar3 = ImRect::Overlaps(cull_rect,&local_48);
  if (bVar3) {
    local_38.y = (this->P1).y;
    local_48.Min.y = local_38.y + this->HalfWeight;
    local_48.Min.x = (this->P1).x;
    local_38.y = local_38.y - this->HalfWeight;
    local_38.x = fVar6;
    AddRectFilled(&local_48.Min,&local_38,this->Col,DrawList,*uv);
    local_48.Min.y = fVar7;
    local_48.Min.x = fVar6 - this->HalfWeight;
    local_38.x = this->HalfWeight + fVar6;
    local_38.y = (this->P1).y;
    AddRectFilled(&local_48.Min,&local_38,this->Col,DrawList,*uv);
  }
  this->P1 = IVar2;
  return bVar3;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }